

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O1

void drawMap(WINDOW *body,Map *map)

{
  int iVar1;
  int iVar2;
  char (*pacVar3) [73];
  ulong uVar4;
  
  pacVar3 = map->overlay;
  uVar4 = 0;
  do {
    iVar1 = wmove(body,uVar4 & 0xffffffff,1);
    if (iVar1 != -1) {
      waddnstr(body,pacVar3,0xffffffff);
    }
    uVar4 = uVar4 + 1;
    pacVar3 = pacVar3 + 1;
  } while (uVar4 != 0x10);
  iVar1 = 0;
  do {
    iVar2 = wmove(body,iVar1,0);
    if (iVar2 != -1) {
      waddch(body,_DAT_00109278);
    }
    iVar2 = wmove(body,iVar1,0x4f);
    if (iVar2 != -1) {
      waddch(body,_DAT_00109278);
    }
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x18);
  return;
}

Assistant:

void drawMap(WINDOW *body, struct Map *map) {
    int y;
    for (y = 0; y < MAP_ROWS; y++)
        mvwaddstr(body, y, 1, map->overlay[y]);
    for (y = 0; y < MAX_ROWS; y++) {
        mvwaddch(body, y, 0, ACS_VLINE);
        mvwaddch(body, y, MAX_COLS - 1, ACS_VLINE);
    }
}